

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  size_t delta;
  long lVar6;
  size_t sVar7;
  
  iVar5 = ptls_buffer_reserve(buf,2);
  if (iVar5 == 0) {
    puVar1 = buf->base;
    sVar2 = buf->off;
    (puVar1 + sVar2)[0] = '\0';
    (puVar1 + sVar2)[1] = '\0';
    sVar2 = buf->off;
    buf->off = sVar2 + 2;
    iVar5 = ptls_buffer_reserve(buf,1);
    if (iVar5 == 0) {
      buf->base[buf->off] = '\0';
      buf->off = buf->off + 1;
      iVar5 = ptls_buffer_reserve(buf,2);
      if (iVar5 == 0) {
        puVar1 = buf->base;
        sVar3 = buf->off;
        (puVar1 + sVar3)[0] = '\0';
        (puVar1 + sVar3)[1] = '\0';
        sVar4 = buf->off;
        sVar3 = sVar4 + 2;
        buf->off = sVar3;
        delta = strlen(server_name);
        sVar7 = sVar3;
        if (delta != 0) {
          iVar5 = ptls_buffer_reserve(buf,delta);
          if (iVar5 != 0) {
            return iVar5;
          }
          memcpy(buf->base + buf->off,server_name,delta);
          sVar7 = delta + buf->off;
          buf->off = sVar7;
        }
        buf->base[sVar4] = (uint8_t)(sVar7 - sVar3 >> 8);
        buf->base[sVar4 + 1] = (uint8_t)(sVar7 - sVar3);
        lVar6 = buf->off - (sVar2 + 2);
        buf->base[sVar2] = (uint8_t)((ulong)lVar6 >> 8);
        buf->base[sVar2 + 1] = (uint8_t)lVar6;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}